

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_unsigned_long
          (packer<msgpack::v1::sbuffer> *this,unsigned_long d)

{
  packer<msgpack::v1::sbuffer> *in_RDI;
  unsigned_long in_stack_00000018;
  packer<msgpack::v1::sbuffer> *in_stack_00000020;
  
  pack_imp_uint64<unsigned_long>(in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

inline packer<Stream>& packer<Stream>::pack_unsigned_long(unsigned long d)
{
#if defined(SIZEOF_LONG)
#if SIZEOF_LONG == 2
    pack_imp_uint16(d);
#elif SIZEOF_LONG == 4
    pack_imp_uint32(d);
#else
    pack_imp_uint64(d);
#endif

#elif defined(ULONG_MAX)
#if ULONG_MAX == 0xffffUL
    pack_imp_uint16(d);
#elif ULONG_MAX == 0xffffffffUL
    pack_imp_uint32(d);
#else
    pack_imp_uint64(d);
#endif

#else
    if(sizeof(unsigned long) == 2) {
        pack_imp_uint16(d);
    } else if(sizeof(unsigned long) == 4) {
        pack_imp_uint32(d);
    } else {
        pack_imp_uint64(d);
    }
#endif
    return *this;
}